

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O3

Expression __thiscall
dynet::UnidirectionalTreeLSTMBuilder::add_input
          (UnidirectionalTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  pointer *ppEVar1;
  uint *puVar2;
  iterator __position;
  uint *puVar3;
  RNNPointer prev;
  RNNPointer local_3c;
  Expression local_38;
  
  local_3c = -1;
  local_38 = RNNBuilder::add_input(&(this->node_builder).super_RNNBuilder,&local_3c,x);
  local_3c = (this->node_builder).super_RNNBuilder.cur;
  puVar3 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar2 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    do {
      local_38 = RNNBuilder::add_input
                           (&(this->node_builder).super_RNNBuilder,&local_3c,
                            (this->h).
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start + *puVar3);
      local_3c = (this->node_builder).super_RNNBuilder.cur;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  __position._M_current =
       (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
    _M_realloc_insert<dynet::Expression_const&>
              ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&this->h,__position,
               &local_38);
  }
  else {
    (__position._M_current)->pg = local_38.pg;
    (__position._M_current)->i = local_38.i;
    (__position._M_current)->graph_id = local_38.graph_id;
    ppEVar1 = &(this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return local_38;
}

Assistant:

Expression UnidirectionalTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");

  RNNPointer prev = (RNNPointer)(-1);
  Expression embedding = node_builder.add_input(prev, x);
  prev = node_builder.state();

  for (unsigned child : children) {
    embedding = node_builder.add_input(prev, h[child]);
    prev = node_builder.state();
  }
  h.push_back(embedding);
  return embedding;
}